

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::pmr::monotonic_buffer_resource::~monotonic_buffer_resource(monotonic_buffer_resource *this)

{
  ~monotonic_buffer_resource(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

~monotonic_buffer_resource() { release(); }